

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void Ppmd8_Construct(CPpmd8 *p)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  p->Base = (Byte *)0x0;
  uVar2 = 0;
  uVar5 = 0;
  do {
    iVar6 = ((uint)(uVar2 >> 2) & 0x3fffffff) + 1;
    if (0xb < uVar2) {
      iVar6 = 4;
    }
    iVar7 = 0;
    uVar4 = uVar5;
    do {
      uVar8 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
      p->Units2Indx[uVar8] = (Byte)uVar2;
      iVar7 = iVar7 + -1;
    } while (-iVar6 != iVar7);
    p->Indx2Units[uVar2] = (char)uVar5 - (char)iVar7;
    uVar2 = uVar2 + 1;
    uVar5 = uVar4;
  } while (uVar2 != 0x26);
  p->NS2BSIndx[0] = '\0';
  p->NS2BSIndx[1] = '\x02';
  p->NS2BSIndx[2] = '\x04';
  p->NS2BSIndx[3] = '\x04';
  p->NS2BSIndx[4] = '\x04';
  p->NS2BSIndx[5] = '\x04';
  p->NS2BSIndx[6] = '\x04';
  p->NS2BSIndx[7] = '\x04';
  p->NS2BSIndx[8] = '\x04';
  p->NS2BSIndx[9] = '\x04';
  p->NS2BSIndx[10] = '\x04';
  memset(p->NS2BSIndx + 0xb,6,0xf5);
  lVar3 = 0;
  do {
    p->NS2Indx[lVar3] = (Byte)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  iVar6 = 1;
  iVar7 = 5;
  lVar3 = 0;
  do {
    p->NS2Indx[lVar3 + 5] = (Byte)iVar7;
    iVar1 = iVar6 + -1;
    iVar6 = iVar1;
    if (iVar1 == 0) {
      iVar6 = iVar7 + -3;
    }
    iVar7 = (uint)(iVar1 == 0) + iVar7;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xff);
  return;
}

Assistant:

void Ppmd8_Construct(CPpmd8 *p)
{
  unsigned i, k, m;

  p->Base = 0;

  for (i = 0, k = 0; i < PPMD_NUM_INDEXES; i++)
  {
    unsigned step = (i >= 12 ? 4 : (i >> 2) + 1);
    do { p->Units2Indx[k++] = (Byte)i; } while (--step);
    p->Indx2Units[i] = (Byte)k;
  }

  p->NS2BSIndx[0] = (0 << 1);
  p->NS2BSIndx[1] = (1 << 1);
  memset(p->NS2BSIndx + 2, (2 << 1), 9);
  memset(p->NS2BSIndx + 11, (3 << 1), 256 - 11);

  for (i = 0; i < 5; i++)
    p->NS2Indx[i] = (Byte)i;
  for (m = i, k = 1; i < 260; i++)
  {
    p->NS2Indx[i] = (Byte)m;
    if (--k == 0)
      k = (++m) - 4;
  }
}